

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O1

int uv_cpu_info(uv_cpu_info_t **cpu_infos,int *count)

{
  int iVar1;
  ulong uVar2;
  uv_cpu_info_t *cpu_infos_00;
  FILE *pFVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  int *piVar7;
  ulong uVar8;
  uint uVar9;
  uv_cpu_info_t *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  uint local_48c;
  ulong local_488;
  unsigned_long user;
  uv_cpu_info_t **local_478;
  int *local_470;
  ulong local_468;
  unsigned_long irq;
  unsigned_long idle;
  unsigned_long sys;
  unsigned_long nice;
  unsigned_long dummy;
  char buf [1024];
  
  *cpu_infos = (uv_cpu_info_t *)0x0;
  *count = 0;
  uVar2 = sysconf(0x54);
  uVar9 = (uint)uVar2;
  if (uVar9 == 0) {
    __assert_fail("numcpus != 0","src/unix/linux-core.c",0x1d4,
                  "int uv_cpu_info(uv_cpu_info_t **, int *)");
  }
  if (uVar9 == 0xffffffff) {
    __assert_fail("numcpus != (unsigned int) -1","src/unix/linux-core.c",0x1d3,
                  "int uv_cpu_info(uv_cpu_info_t **, int *)");
  }
  cpu_infos_00 = (uv_cpu_info_t *)calloc(uVar2 & 0xffffffff,0x38);
  if (cpu_infos_00 == (uv_cpu_info_t *)0x0) {
    iVar1 = -0xc;
  }
  else {
    pFVar3 = fopen("/proc/cpuinfo","r");
    local_478 = cpu_infos;
    local_470 = count;
    if (pFVar3 == (FILE *)0x0) {
      piVar7 = __errno_location();
      iVar1 = -*piVar7;
    }
    else {
      pcVar4 = fgets(buf,0x400,pFVar3);
      if (pcVar4 == (char *)0x0) {
        uVar8 = 0;
      }
      else {
        uVar11 = 0;
        uVar8 = 0;
        do {
          uVar11 = uVar11 & 0xffffffff;
          while (((uVar2 & 0xffffffff) <= uVar8 ||
                 (CONCAT26(buf._11_2_,CONCAT33(buf._8_3_,buf._5_3_)) != 0x203a09656d616e20 ||
                  CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) !=
                  0x616e206c65646f6d))) {
            uVar12 = uVar11;
            if ((uVar11 < (uVar2 & 0xffffffff)) &&
               (CONCAT35(buf._8_3_,CONCAT41(buf._4_4_,buf[3])) == 0x203a09097a484d20 &&
                CONCAT44(buf._4_4_,CONCAT13(buf[3],CONCAT12(buf[2],buf._0_2_))) == 0x97a484d20757063
               )) {
              iVar1 = atoi(buf + 0xb);
              uVar12 = uVar11 + 1;
              cpu_infos_00[uVar11].speed = iVar1;
            }
            pcVar4 = fgets(buf,0x400,pFVar3);
            uVar11 = uVar12;
            if (pcVar4 == (char *)0x0) goto LAB_0011399d;
          }
          sVar5 = strlen(buf + 0xd);
          pcVar4 = strndup(buf + 0xd,sVar5 - 1);
          if (pcVar4 == (char *)0x0) {
            fclose(pFVar3);
            iVar1 = -0xc;
            goto LAB_00113a0d;
          }
          uVar12 = uVar8 + 1;
          cpu_infos_00[uVar8].model = pcVar4;
          pcVar4 = fgets(buf,0x400,pFVar3);
          uVar8 = uVar12;
        } while (pcVar4 != (char *)0x0);
      }
LAB_0011399d:
      fclose(pFVar3);
      uVar13 = (uint)uVar8;
      if (uVar13 == 0) {
        pcVar4 = "unknown";
      }
      else {
        pcVar4 = cpu_infos_00[uVar13 - 1].model;
      }
      iVar1 = 0;
      if (uVar13 < uVar9) {
        puVar10 = cpu_infos_00 + (uVar8 & 0xffffffff);
        lVar14 = (uVar2 & 0xffffffff) - (uVar8 & 0xffffffff);
        do {
          sVar5 = strlen(pcVar4);
          pcVar6 = strndup(pcVar4,sVar5);
          if (pcVar6 == (char *)0x0) {
            iVar1 = -0xc;
            break;
          }
          puVar10->model = pcVar6;
          puVar10 = puVar10 + 1;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
    }
LAB_00113a0d:
    if (iVar1 == 0) {
      lVar14 = sysconf(2);
      if (lVar14 == 0) {
        __assert_fail("clock_ticks != 0","src/unix/linux-core.c",0x26a,
                      "int read_times(unsigned int, uv_cpu_info_t *)");
      }
      if (lVar14 == -1) {
        __assert_fail("clock_ticks != (unsigned long) -1","src/unix/linux-core.c",0x269,
                      "int read_times(unsigned int, uv_cpu_info_t *)");
      }
      pFVar3 = fopen("/proc/stat","r");
      if (pFVar3 == (FILE *)0x0) {
        piVar7 = __errno_location();
        iVar1 = -*piVar7;
      }
      else {
        pcVar4 = fgets(buf,0x400,pFVar3);
        if (pcVar4 == (char *)0x0) {
LAB_00113d03:
          abort();
        }
        pcVar4 = fgets(buf,0x400,pFVar3);
        local_488 = uVar2;
        if ((uVar9 != 0) && (pcVar4 != (char *)0x0)) {
          local_468 = uVar2 & 0xffffffff;
          uVar2 = 0;
          while (buf[2] == 'u' && buf._0_2_ == 0x7063) {
            uVar9 = 4;
            uVar8 = uVar2 & 0xffffffff;
            do {
              uVar11 = uVar8;
              uVar9 = uVar9 + 1;
              uVar8 = uVar11 / 10;
            } while (9 < (uint)uVar11);
            local_48c = (uint)(uVar11 / 10);
            iVar1 = __isoc99_sscanf(buf,"cpu%u ",&local_48c);
            if ((iVar1 != 1) || (uVar2 != local_48c)) {
              __assert_fail("sscanf(buf, \"cpu%u \", &n) == 1 && n == num","src/unix/linux-core.c",
                            0x280,"int read_times(unsigned int, uv_cpu_info_t *)");
            }
            iVar1 = __isoc99_sscanf(buf + uVar9,"%lu %lu %lu %lu %lu %lu",&user,&nice,&sys,&idle,
                                    &dummy,&irq);
            if (iVar1 != 6) goto LAB_00113d03;
            cpu_infos_00[uVar2].cpu_times.user = user * lVar14;
            cpu_infos_00[uVar2].cpu_times.nice = nice * lVar14;
            cpu_infos_00[uVar2].cpu_times.sys = sys * lVar14;
            cpu_infos_00[uVar2].cpu_times.idle = idle * lVar14;
            cpu_infos_00[uVar2].cpu_times.irq = irq * lVar14;
            pcVar4 = fgets(buf,0x400,pFVar3);
            if ((pcVar4 == (char *)0x0) || (uVar2 = uVar2 + 1, local_468 <= uVar2)) break;
          }
        }
        fclose(pFVar3);
        iVar1 = 0;
        uVar2 = local_488;
      }
    }
    if (iVar1 == 0) {
      local_488 = uVar2;
      if (((int)uVar2 != 0) && (cpu_infos_00->speed == 0)) {
        piVar7 = &cpu_infos_00->speed;
        uVar8 = 0;
        do {
          snprintf(buf,0x400,"/sys/devices/system/cpu/cpu%u/cpufreq/scaling_cur_freq",
                   uVar8 & 0xffffffff);
          pFVar3 = fopen(buf,"r");
          iVar1 = 0;
          if (pFVar3 != (FILE *)0x0) {
            iVar1 = __isoc99_fscanf(pFVar3,"%lu",&user);
            if (iVar1 != 1) {
              user = 0;
            }
            fclose(pFVar3);
            iVar1 = (int)(user / 1000);
          }
          *piVar7 = iVar1;
          uVar8 = uVar8 + 1;
          piVar7 = piVar7 + 0xe;
        } while ((uVar2 & 0xffffffff) != uVar8);
      }
      *local_478 = cpu_infos_00;
      *local_470 = (int)local_488;
      iVar1 = 0;
    }
    else {
      uv_free_cpu_info(cpu_infos_00,(int)uVar2);
    }
  }
  return iVar1;
}

Assistant:

int uv_cpu_info(uv_cpu_info_t** cpu_infos, int* count) {
  unsigned int numcpus;
  uv_cpu_info_t* ci;
  int err;

  *cpu_infos = NULL;
  *count = 0;

  numcpus = sysconf(_SC_NPROCESSORS_ONLN);
  assert(numcpus != (unsigned int) -1);
  assert(numcpus != 0);

  ci = calloc(numcpus, sizeof(*ci));
  if (ci == NULL)
    return -ENOMEM;

  err = read_models(numcpus, ci);
  if (err == 0)
    err = read_times(numcpus, ci);

  if (err) {
    uv_free_cpu_info(ci, numcpus);
    return err;
  }

  /* read_models() on x86 also reads the CPU speed from /proc/cpuinfo.
   * We don't check for errors here. Worst case, the field is left zero.
   */
  if (ci[0].speed == 0)
    read_speeds(numcpus, ci);

  *cpu_infos = ci;
  *count = numcpus;

  return 0;
}